

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9_hashmap_shift(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  jx9_hashmap_node *pjVar2;
  jx9_vm *pjVar3;
  jx9_value *pSrc;
  int iVar4;
  
  if (((nArg < 1) || (((*apArg)->iFlags & 0x40) == 0)) ||
     (lVar1 = ((*apArg)->x).iVal, *(int *)(lVar1 + 0x2c) == 0)) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    pjVar2 = *(jx9_hashmap_node **)(lVar1 + 0x10);
    pjVar3 = pjVar2->pMap->pVm;
    if (pjVar2->nValIdx < (pjVar3->aMemObj).nUsed) {
      pSrc = (jx9_value *)
             ((ulong)(pjVar2->nValIdx * (pjVar3->aMemObj).eSize) + (long)(pjVar3->aMemObj).pBase);
    }
    else {
      pSrc = (jx9_value *)0x0;
    }
    if (pSrc == (jx9_value *)0x0) {
      jx9MemObjRelease(pCtx->pRet);
    }
    else {
      jx9MemObjStore(pSrc,pCtx->pRet);
      jx9HashmapUnlinkNode(pjVar2);
    }
    iVar4 = *(int *)(lVar1 + 0x2c);
    pjVar2 = *(jx9_hashmap_node **)(lVar1 + 0x10);
    *(undefined8 *)(lVar1 + 0x48) = 0;
    for (; iVar4 != 0; iVar4 = iVar4 + -1) {
      if (pjVar2->iType == 1) {
        HashmapRehashIntNode(pjVar2);
      }
      pjVar2 = pjVar2->pPrev;
    }
    *(undefined8 *)(lVar1 + 0x20) = *(undefined8 *)(lVar1 + 0x10);
  }
  return 0;
}

Assistant:

static int jx9_hashmap_shift(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation of the hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry < 1 ){
		/* Empty hashmap, return NULL */
		jx9_result_null(pCtx);
	}else{
		jx9_hashmap_node *pEntry = pMap->pFirst;
		jx9_value *pObj;
		sxu32 n;
		pObj = HashmapExtractNodeValue(pEntry);
		if( pObj ){
			/* Node value */
			jx9_result_value(pCtx, pObj);
			/* Unlink the first node */
			jx9HashmapUnlinkNode(pEntry);
		}else{
			jx9_result_null(pCtx);
		}
		/* Rehash all int keys */
		n = pMap->nEntry;
		pEntry = pMap->pFirst;
		pMap->iNextIdx = 0; /* Reset the automatic index */
		for(;;){
			if( n < 1 ){
				break;
			}
			if( pEntry->iType == HASHMAP_INT_NODE ){
				HashmapRehashIntNode(pEntry);
			}
			/* Point to the next entry */
			pEntry = pEntry->pPrev; /* Reverse link */
			n--;
		}
		/* Reset the cursor */
		pMap->pCur = pMap->pFirst;
	}
	return JX9_OK;
}